

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.hxx
# Opt level: O0

stat_elem * __thiscall nuraft::stat_elem::operator-=(stat_elem *this,size_t amount)

{
  Type TVar1;
  size_t in_RSI;
  stat_elem *in_RDI;
  
  TVar1 = in_RDI->stat_type_;
  if ((TVar1 == COUNTER) || ((TVar1 != HISTOGRAM && (TVar1 == GAUGE)))) {
    dec(in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

stat_elem& operator-=(size_t amount) {
        switch (stat_type_) {
        case COUNTER:
        case GAUGE:
            dec(amount);
            break;
        case HISTOGRAM:
            assert(0);
            break;
        default: break;
        }
        return *this;
    }